

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_constructor_test.h
# Opt level: O0

void phmap::priv::
     AllocTest<phmap::node_hash_set<phmap::priv::hash_internal::Enum,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::Enum>>>
               (void)

{
  _Head_base<0UL,_unsigned_long,_false> *this;
  bool bVar1;
  char *pcVar2;
  node_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
  *s;
  char *in_R9;
  AssertHelper local_120;
  Message local_118;
  vector<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>
  local_110;
  char local_f1;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_c0;
  Message local_b8;
  bool local_a9;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_;
  Message local_90;
  undefined1 local_88 [8];
  undefined1 local_80 [8];
  AssertionResult gtest_ar;
  undefined1 local_60 [8];
  node_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
  m;
  A alloc;
  
  this = &m.
          super_raw_hash_set<phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
          .settings_.
          super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
          .super__Head_base<0UL,_unsigned_long,_false>;
  Alloc<phmap::priv::hash_internal::Enum>::Alloc((Alloc<phmap::priv::hash_internal::Enum> *)this,0);
  node_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
  ::raw_hash_set((node_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
                  *)local_60,(allocator_type *)this);
  raw_hash_set<phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
  ::get_allocator((raw_hash_set<phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
                   *)local_88);
  testing::internal::EqHelper::
  Compare<phmap::priv::Alloc<phmap::priv::hash_internal::Enum>,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>,_nullptr>
            ((EqHelper *)local_80,"m.get_allocator()","alloc",
             (Alloc<phmap::priv::hash_internal::Enum> *)local_88,
             (Alloc<phmap::priv::hash_internal::Enum> *)
             &m.
              super_raw_hash_set<phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
              .settings_.
              super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
              .super__Head_base<0UL,_unsigned_long,_false>);
  Alloc<phmap::priv::hash_internal::Enum>::~Alloc
            ((Alloc<phmap::priv::hash_internal::Enum> *)local_88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_constructor_test.h"
               ,0xaa,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_a9 = raw_hash_set<phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
             ::empty((raw_hash_set<phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
                      *)local_60);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_a8,&local_a9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_a8,(AssertionResult *)0x28437b,
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_constructor_test.h"
               ,0xab,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  testing::UnorderedElementsAre<>();
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<>>>();
  keys<phmap::node_hash_set<phmap::priv::hash_internal::Enum,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::Enum>>>
            (&local_110,(priv *)local_60,s);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<>>>::
  operator()(local_f0,&local_f1,
             (vector<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>
              *)"keys(m)");
  std::vector<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>::
  ~vector(&local_110);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_constructor_test.h"
               ,0xac,pcVar2);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  node_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
  ::~node_hash_set((node_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
                    *)local_60);
  Alloc<phmap::priv::hash_internal::Enum>::~Alloc
            ((Alloc<phmap::priv::hash_internal::Enum> *)
             &m.
              super_raw_hash_set<phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
              .settings_.
              super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
              .super__Head_base<0UL,_unsigned_long,_false>);
  return;
}

Assistant:

void AllocTest(std::true_type) {
  using A = typename TypeParam::allocator_type;
  A alloc(0);
  TypeParam m(alloc);
  EXPECT_EQ(m.get_allocator(), alloc);
  EXPECT_TRUE(m.empty());
  EXPECT_THAT(keys(m), ::testing::UnorderedElementsAre());
}